

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_helper.cpp
# Opt level: O2

bool __thiscall
duckdb::TestResultHelper::CheckQueryResult
          (TestResultHelper *this,Query *query,ExecuteContext *context,
          unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
          *owned_result)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *__x
  ;
  SortStyle SVar1;
  SQLLogicTestRunner *this_00;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var2;
  pointer pbVar3;
  idx_t original_expected_columns;
  pointer pvVar4;
  pointer pvVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  type result;
  string *psVar9;
  long lVar10;
  long lVar11;
  ulong __val;
  const_reference pvVar12;
  ulong uVar13;
  ulong uVar14;
  reference pvVar15;
  reference this_01;
  reference this_02;
  iterator iVar16;
  idx_t iVar17;
  idx_t iVar18;
  mapped_type *pmVar19;
  iterator iVar20;
  mapped_type *pmVar21;
  idx_t iVar22;
  ulong uVar23;
  idx_t row_idx;
  ulong uVar24;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var25;
  SQLLogicTestLogger *this_03;
  int iVar26;
  idx_t col_idx;
  size_type __n;
  __normal_iterator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_*,_std::vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
  __i;
  pointer pvVar27;
  idx_t i;
  size_type sVar28;
  iterator __begin3;
  pointer pbVar29;
  bool bVar30;
  bool bVar31;
  idx_t local_3c8;
  idx_t expected_column_count;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  comparison_values;
  string hash_value;
  string digest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  result_values_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
  rows;
  string local_248;
  StringRef local_228;
  StringRef local_218;
  SQLLogicTestLogger logger;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  StringRef local_100;
  string local_f0;
  string local_d0 [32];
  string local_b0;
  string local_90;
  string local_70 [32];
  string local_50;
  
  result = unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator*(owned_result);
  this_00 = (query->super_Command).runner;
  expected_column_count = query->expected_column_count;
  SVar1 = query->sort_style;
  bVar7 = query->query_has_label;
  SQLLogicTestLogger::SQLLogicTestLogger(&logger,context,&query->super_Command);
  cVar6 = duckdb::BaseQueryResult::HasError();
  if (cVar6 != '\0') {
    SQLLogicTestLogger::UnexpectedFailure(&logger,result);
    psVar9 = (string *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
    bVar7 = SkipErrorMessage(this,psVar9);
    if (bVar7) {
      bVar7 = true;
      LOCK();
      (this_00->finished_processing_file)._M_base._M_i = true;
      UNLOCK();
    }
    else {
      bVar7 = false;
    }
    goto LAB_003eb3bb;
  }
  lVar10 = duckdb::MaterializedQueryResult::RowCount();
  lVar11 = duckdb::BaseQueryResult::ColumnCount();
  __val = lVar11 * lVar10;
  bVar31 = true;
  if (bVar7 == false) {
    if ((long)this_00->hash_threshold < 1) {
      bVar31 = false;
    }
    else {
      bVar31 = (ulong)(long)this_00->hash_threshold < __val;
    }
  }
  __x = &query->values;
  if ((long)(query->values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(query->values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::get<true>(__x,0);
    bVar8 = ResultIsHash((string *)pvVar12);
    if (bVar8) {
      bVar31 = true;
    }
  }
  else {
    bVar8 = false;
  }
  result_values_string.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result_values_string.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result_values_string.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_03 = (SQLLogicTestLogger *)this;
  DuckDBConvertResult(this,result,this_00->original_sqlite_test,&result_values_string);
  if (this_00->output_result_mode == true) {
    SQLLogicTestLogger::OutputResult(this_03,result,&result_values_string);
  }
  if (SVar1 == VALUE_SORT) {
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (result_values_string.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  else if (SVar1 == ROW_SORT) {
    uVar13 = duckdb::BaseQueryResult::ColumnCount();
    uVar14 = __val / uVar13;
    rows.
    super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rows.
    super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rows.
    super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    .
    super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ::reserve(&rows.
               super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              ,uVar14);
    sVar28 = 0;
    for (uVar24 = 0;
        pvVar5 = rows.
                 super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 .
                 super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        pvVar4 = rows.
                 super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 .
                 super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, uVar24 < uVar14; uVar24 = uVar24 + 1) {
      hash_value._M_dataplus._M_p = (pointer)0x0;
      hash_value._M_string_length = 0;
      hash_value.field_2._M_allocated_capacity = 0;
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&hash_value,uVar13);
      uVar23 = uVar13;
      __n = sVar28;
      while (bVar30 = uVar23 != 0, uVar23 = uVar23 - 1, bVar30) {
        pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(&result_values_string,__n);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&hash_value,
                   pvVar15);
        __n = __n + 1;
      }
      std::
      vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>
      ::emplace_back<duckdb::vector<std::__cxx11::string,true>>
                ((vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>
                  *)&rows,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)&hash_value);
      Catch::clara::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&hash_value);
      sVar28 = sVar28 + uVar13;
    }
    if (rows.
        super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
        .
        super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        rows.
        super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
        .
        super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar11 = (long)rows.
                     super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                     .
                     super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)rows.
                     super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                     .
                     super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar24 = lVar11 / 0x18;
      lVar10 = 0x3f;
      if (uVar24 != 0) {
        for (; uVar24 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<duckdb::vector<std::__cxx11::string,true>*,std::vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::TestResultHelper::CheckQueryResult(duckdb::Query_const&,duckdb::ExecuteContext&,duckdb::unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<duckdb::MaterializedQueryResult>,true>)::__0>>
                (rows.
                 super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 .
                 super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 rows.
                 super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 .
                 super__Vector_base<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar11 < 0x181) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::vector<std::__cxx11::string,true>*,std::vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::TestResultHelper::CheckQueryResult(duckdb::Query_const&,duckdb::ExecuteContext&,duckdb::unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<duckdb::MaterializedQueryResult>,true>)::__0>>
                  (pvVar4);
      }
      else {
        pvVar27 = pvVar4 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<duckdb::vector<std::__cxx11::string,true>*,std::vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::TestResultHelper::CheckQueryResult(duckdb::Query_const&,duckdb::ExecuteContext&,duckdb::unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<duckdb::MaterializedQueryResult>,true>)::__0>>
                  (pvVar4);
        for (; pvVar27 != pvVar5; pvVar27 = pvVar27 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<duckdb::vector<std::__cxx11::string,true>*,std::vector<duckdb::vector<std::__cxx11::string,true>,std::allocator<duckdb::vector<std::__cxx11::string,true>>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::TestResultHelper::CheckQueryResult(duckdb::Query_const&,duckdb::ExecuteContext&,duckdb::unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<duckdb::MaterializedQueryResult>,true>)::__0>>
                    (pvVar27);
        }
      }
    }
    lVar10 = 0;
    for (uVar24 = 0; uVar24 < uVar14; uVar24 = uVar24 + 1) {
      for (sVar28 = 0; uVar13 != sVar28; sVar28 = sVar28 + 1) {
        this_01 = vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_true>
                  ::get<true>(&rows,uVar24);
        pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(this_01,sVar28);
        this_02 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(&result_values_string,lVar10 + sVar28);
        std::__cxx11::string::operator=((string *)this_02,(string *)pvVar15);
      }
      lVar10 = lVar10 + uVar13;
    }
    std::
    vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
    ::~vector(&rows.
               super_vector<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::allocator<duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
             );
  }
  comparison_values.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comparison_values.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comparison_values.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((long)(query->values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(query->values).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::get<true>(__x,0);
    std::__cxx11::string::string((string *)&local_160,(string *)pvVar12);
    bVar30 = ResultIsFile(&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    if (!bVar30) goto LAB_003ea8c3;
    pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::get<true>(__x,0);
    std::__cxx11::string::string((string *)&local_180,(string *)pvVar12);
    SQLLogicTestRunner::LoopReplacement((string *)&rows,this_00,&local_180,&context->running_loops);
    std::__cxx11::string::~string((string *)&local_180);
    hash_value._M_dataplus._M_p = (pointer)&hash_value.field_2;
    hash_value._M_string_length = 0;
    hash_value.field_2._M_allocated_capacity =
         hash_value.field_2._M_allocated_capacity & 0xffffffffffffff00;
    std::__cxx11::string::string((string *)&local_1a0,(string *)&rows);
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1b8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(result + 0xb0));
    LoadResultFromFile((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&digest,this,&local_1a0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)&local_1b8,&expected_column_count,&hash_value);
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&comparison_values,&digest);
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&digest);
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1a0);
    if (hash_value._M_string_length == 0) {
      std::__cxx11::string::~string((string *)&hash_value);
      std::__cxx11::string::~string((string *)&rows);
      goto LAB_003ea8d2;
    }
    SQLLogicTestLogger::PrintErrorHeader(&logger,&hash_value);
    std::__cxx11::string::~string((string *)&hash_value);
    std::__cxx11::string::~string((string *)&rows);
    bVar7 = false;
  }
  else {
LAB_003ea8c3:
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&comparison_values,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)__x);
LAB_003ea8d2:
    hash_value._M_dataplus._M_p = (pointer)&hash_value.field_2;
    hash_value._M_string_length = 0;
    hash_value.field_2._M_allocated_capacity =
         hash_value.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if ((this_00->output_hash_mode != false) || (bVar31)) {
      duckdb::MD5Context::MD5Context((MD5Context *)&rows);
      psVar9 = &query->query_label;
      for (sVar28 = 0; __val != sVar28; sVar28 = sVar28 + 1) {
        pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::get<true>(&result_values_string,sVar28);
        MD5Context::Add((MD5Context *)&rows,(string *)pvVar15);
        duckdb::MD5Context::Add((char *)&rows);
      }
      duckdb::MD5Context::FinishHex_abi_cxx11_();
      std::__cxx11::to_string(&local_248,__val);
      std::operator+(&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_248
                     ," values hashing to ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&splits,
                     &local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&digest);
      std::__cxx11::string::operator=((string *)&hash_value,(string *)&splits);
      std::__cxx11::string::~string((string *)&splits);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_248);
      if (this_00->output_hash_mode == true) {
        SQLLogicTestLogger::OutputHash(&logger,&hash_value);
        std::__cxx11::string::~string((string *)&digest);
      }
      else {
        std::__cxx11::string::~string((string *)&digest);
        if (!bVar31) goto LAB_003eaa86;
        if (bVar7 == false) {
LAB_003eb25c:
          bVar7 = false;
        }
        else {
          iVar16 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this_00->hash_label_map)._M_h,psVar9);
          if (iVar16.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pmVar19 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this_00->hash_label_map,psVar9);
            std::__cxx11::string::_M_assign((string *)pmVar19);
            _Var25._M_head_impl =
                 (QueryResult *)
                 (owned_result->
                 super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
                 .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl;
            (owned_result->
            super_unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MaterializedQueryResult_*,_std::default_delete<duckdb::MaterializedQueryResult>_>
            .super__Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false>._M_head_impl =
                 (MaterializedQueryResult *)0x0;
            pmVar21 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this_00->result_label_map,psVar9);
            _Var2._M_head_impl =
                 (pmVar21->
                 super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
                 .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
            (pmVar21->
            super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)._M_t.
            super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>.
            _M_t.
            super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
            .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl = _Var25._M_head_impl;
            if (_Var2._M_head_impl != (QueryResult *)0x0) {
              (**(code **)(*(long *)_Var2._M_head_impl + 8))();
            }
            goto LAB_003eb25c;
          }
          bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)iVar16.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                            ._M_cur + 0x28),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&hash_value);
        }
        if (bVar8 == false) {
          if (bVar7 != false) goto LAB_003eb335;
        }
        else {
          pvVar12 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>(__x,0);
          bVar7 = std::operator!=(pvVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&hash_value);
          if (bVar7) {
LAB_003eb335:
            iVar20 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(this_00->result_label_map)._M_h,psVar9);
            if (iVar20.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              _Var25._M_head_impl = (QueryResult *)0x0;
            }
            else {
              pmVar21 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&this_00->result_label_map,psVar9);
              _Var25._M_head_impl =
                   (pmVar21->
                   super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>
                   .super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
            }
            SQLLogicTestLogger::WrongResultHash(&logger,_Var25._M_head_impl,result);
            goto LAB_003eb394;
          }
        }
        digest._M_dataplus._M_p = "REQUIRE";
        digest._M_string_length = 7;
        splits.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7262b2;
        splits.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf4;
        Catch::StringRef::StringRef(&local_100,"!hash_compare_error");
        Catch::AssertionHandler::AssertionHandler
                  ((AssertionHandler *)&rows,(StringRef *)&digest,(SourceLineInfo *)&splits,
                   local_100,Normal);
        digest._M_dataplus._M_p._0_1_ = 1;
        Catch::AssertionHandler::handleExpr<bool>
                  ((AssertionHandler *)&rows,(ExprLhs<bool> *)&digest);
        Catch::AssertionHandler::complete((AssertionHandler *)&rows);
        Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&rows);
      }
      bVar7 = true;
      goto LAB_003eb397;
    }
LAB_003eaa86:
    original_expected_columns = expected_column_count;
    iVar17 = duckdb::BaseQueryResult::ColumnCount();
    iVar18 = original_expected_columns;
    if (original_expected_columns != iVar17) {
      iVar18 = duckdb::BaseQueryResult::ColumnCount();
      expected_column_count = iVar18;
    }
    if (iVar18 == 0) {
LAB_003eb394:
      bVar7 = false;
    }
    else {
      uVar14 = (long)comparison_values.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)comparison_values.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar13 = uVar14 / iVar18;
      pbVar29 = comparison_values.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = comparison_values.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((iVar18 == 1) ||
         (uVar24 = duckdb::MaterializedQueryResult::RowCount(),
         pbVar29 = comparison_values.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         pbVar3 = comparison_values.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, uVar14 != uVar24)) {
        do {
          if (pbVar29 == pbVar3) goto LAB_003eaba2;
          lVar10 = std::__cxx11::string::find((char)pbVar29,9);
          pbVar29 = pbVar29 + 1;
        } while (lVar10 != -1);
        iVar22 = (long)comparison_values.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)comparison_values.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        bVar7 = false;
        if (iVar22 % iVar18 == 0) goto LAB_003eabaf;
        if (original_expected_columns == iVar17) {
          SQLLogicTestLogger::NotCleanlyDivisible(&logger,iVar18,iVar22);
          goto LAB_003eb394;
        }
        bVar7 = false;
LAB_003eb377:
        SQLLogicTestLogger::ColumnCountMismatch(&logger,result,__x,original_expected_columns,bVar7);
        goto LAB_003eb394;
      }
LAB_003eaba2:
      uVar13 = (long)comparison_values.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)comparison_values.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      bVar7 = true;
LAB_003eabaf:
      iVar22 = duckdb::MaterializedQueryResult::RowCount();
      if (uVar13 != iVar22) {
        if (original_expected_columns == iVar17) {
          SQLLogicTestLogger::WrongRowCount(&logger,uVar13,result,&comparison_values,iVar18,bVar7);
          goto LAB_003eb394;
        }
        goto LAB_003eb377;
      }
      if (bVar7 == false) {
        local_3c8 = 0;
        iVar22 = 0;
        for (uVar13 = 0;
            (__val != uVar13 &&
            (uVar13 < (ulong)((long)comparison_values.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)comparison_values.
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5)));
            uVar13 = uVar13 + 1) {
          pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>(&result_values_string,iVar18 * local_3c8 + iVar22);
          std::__cxx11::string::string((string *)&local_140,(string *)pvVar15);
          pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>(&comparison_values,uVar13);
          std::__cxx11::string::string((string *)&local_b0,(string *)pvVar15);
          psVar9 = &local_b0;
          bVar7 = CompareValues(this,&logger,result,&local_140,&local_b0,local_3c8,iVar22,
                                &comparison_values,iVar18,false,&result_values_string);
          iVar26 = (int)psVar9;
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_140);
          if (!bVar7) goto LAB_003eb394;
          std::__cxx11::string::string(local_d0,"CheckQueryResult: %s:%d",(allocator *)&rows);
          std::__cxx11::string::string
                    ((string *)&local_f0,(string *)&(query->super_Command).file_name);
          StringUtil::Format<std::__cxx11::string,int>
                    (&digest,(StringUtil *)local_d0,&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (ulong)(uint)(query->super_Command).query_line,iVar26);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string(local_d0);
          splits.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_148d60;
          splits.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x7;
          local_2d8._M_dataplus._M_p =
               "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/sqlite/result_helper.cpp"
          ;
          local_2d8._M_string_length = 0xce;
          Catch::StringRef::StringRef(&local_228,"success_log.c_str()");
          Catch::AssertionHandler::AssertionHandler
                    ((AssertionHandler *)&rows,(StringRef *)&splits,(SourceLineInfo *)&local_2d8,
                     local_228,Normal);
          local_2d8._M_dataplus._M_p = digest._M_dataplus._M_p;
          splits.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = &local_2d8;
          Catch::AssertionHandler::handleExpr<char_const*const&>
                    ((AssertionHandler *)&rows,(ExprLhs<const_char_*const_&> *)&splits);
          Catch::AssertionHandler::complete((AssertionHandler *)&rows);
          Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&rows);
          iVar18 = expected_column_count;
          iVar22 = iVar22 + 1;
          bVar7 = iVar22 == expected_column_count;
          if (bVar7) {
            iVar22 = 0;
          }
          local_3c8 = local_3c8 + bVar7;
          std::__cxx11::string::~string((string *)&digest);
        }
LAB_003eb1d2:
        bVar7 = true;
        if (original_expected_columns != iVar17) {
          SQLLogicTestLogger::ColumnCountMismatchCorrectResult
                    (&logger,original_expected_columns,expected_column_count,result);
          goto LAB_003eb394;
        }
      }
      else {
        local_3c8 = 0;
        uVar13 = 0;
        do {
          if ((uVar13 == __val) ||
             ((ulong)((long)comparison_values.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)comparison_values.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar13))
          goto LAB_003eb1d2;
          pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>(&comparison_values,uVar13);
          std::__cxx11::string::string
                    ((string *)&rows,anon_var_dwarf_88a171 + 7,(allocator *)&digest);
          duckdb::StringUtil::Split((string *)&splits,(string *)pvVar15);
          std::__cxx11::string::~string((string *)&rows);
          iVar18 = expected_column_count;
          iVar22 = (long)splits.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)splits.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          if (iVar22 == expected_column_count) {
            uVar14 = 0;
            while( true ) {
              iVar18 = expected_column_count;
              uVar24 = (long)splits.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)splits.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
              bVar31 = uVar24 <= uVar14;
              if (bVar31) break;
              pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::get<true>(&result_values_string,expected_column_count * local_3c8 + uVar14
                                   );
              std::__cxx11::string::string((string *)&local_120,(string *)pvVar15);
              pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::get<true>(&splits,uVar14);
              std::__cxx11::string::string((string *)&local_50,(string *)pvVar15);
              psVar9 = &local_50;
              bVar7 = CompareValues(this,&logger,result,&local_120,&local_50,local_3c8,uVar14,
                                    &comparison_values,iVar18,true,&result_values_string);
              iVar26 = (int)psVar9;
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_120);
              if (!bVar7) break;
              std::__cxx11::string::string(local_70,"CheckQueryResult: %s:%d",(allocator *)&rows);
              std::__cxx11::string::string
                        ((string *)&local_90,(string *)&(query->super_Command).file_name);
              StringUtil::Format<std::__cxx11::string,int>
                        (&digest,(StringUtil *)local_70,&local_90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ulong)(uint)(query->super_Command).query_line,iVar26);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string(local_70);
              local_2d8._M_dataplus._M_p = "REQUIRE";
              local_2d8._M_string_length = 7;
              local_248._M_dataplus._M_p =
                   "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/sqlite/result_helper.cpp"
              ;
              local_248._M_string_length = 0xbe;
              Catch::StringRef::StringRef(&local_218,"success_log.c_str()");
              Catch::AssertionHandler::AssertionHandler
                        ((AssertionHandler *)&rows,(StringRef *)&local_2d8,
                         (SourceLineInfo *)&local_248,local_218,Normal);
              local_248._M_dataplus._M_p = digest._M_dataplus._M_p;
              local_2d8._M_dataplus._M_p = (pointer)&local_248;
              Catch::AssertionHandler::handleExpr<char_const*const&>
                        ((AssertionHandler *)&rows,(ExprLhs<const_char_*const_&> *)&local_2d8);
              Catch::AssertionHandler::complete((AssertionHandler *)&rows);
              Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&rows);
              std::__cxx11::string::~string((string *)&digest);
              uVar14 = uVar14 + 1;
            }
            local_3c8 = (local_3c8 + 1) - (ulong)(uVar14 < uVar24);
          }
          else {
            if (original_expected_columns != iVar17) {
              SQLLogicTestLogger::ColumnCountMismatch
                        (&logger,result,__x,original_expected_columns,true);
              iVar22 = (long)splits.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)splits.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
            }
            SQLLogicTestLogger::SplitMismatch(&logger,uVar13 + 1,iVar18,iVar22);
            bVar31 = false;
          }
          uVar13 = uVar13 + 1;
          Catch::clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&splits);
          bVar7 = false;
        } while (bVar31);
      }
    }
LAB_003eb397:
    std::__cxx11::string::~string((string *)&hash_value);
  }
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&comparison_values);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&result_values_string);
LAB_003eb3bb:
  SQLLogicTestLogger::~SQLLogicTestLogger(&logger);
  return bVar7;
}

Assistant:

bool TestResultHelper::CheckQueryResult(const Query &query, ExecuteContext &context,
                                        duckdb::unique_ptr<MaterializedQueryResult> owned_result) {
	auto &result = *owned_result;
	auto &runner = query.runner;
	auto expected_column_count = query.expected_column_count;
	auto &values = query.values;
	auto sort_style = query.sort_style;
	auto query_has_label = query.query_has_label;
	auto &query_label = query.query_label;

	SQLLogicTestLogger logger(context, query);
	if (result.HasError()) {
		logger.UnexpectedFailure(result);
		if (SkipErrorMessage(result.GetError())) {
			runner.finished_processing_file = true;
			return true;
		}
		return false;
	}
	idx_t row_count = result.RowCount();
	idx_t column_count = result.ColumnCount();
	idx_t total_value_count = row_count * column_count;
	bool compare_hash =
	    query_has_label || (runner.hash_threshold > 0 && total_value_count > idx_t(runner.hash_threshold));
	bool result_is_hash = false;
	// check if the current line (the first line of the result) is a hash value
	if (values.size() == 1 && ResultIsHash(values[0])) {
		compare_hash = true;
		result_is_hash = true;
	}

	vector<string> result_values_string;
	DuckDBConvertResult(result, runner.original_sqlite_test, result_values_string);
	if (runner.output_result_mode) {
		logger.OutputResult(result, result_values_string);
	}

	// perform any required query sorts
	if (sort_style == SortStyle::ROW_SORT) {
		// row-oriented sorting
		idx_t ncols = result.ColumnCount();
		idx_t nrows = total_value_count / ncols;
		vector<vector<string>> rows;
		rows.reserve(nrows);
		for (idx_t row_idx = 0; row_idx < nrows; row_idx++) {
			vector<string> row;
			row.reserve(ncols);
			for (idx_t col_idx = 0; col_idx < ncols; col_idx++) {
				row.push_back(std::move(result_values_string[row_idx * ncols + col_idx]));
			}
			rows.push_back(std::move(row));
		}
		// sort the individual rows
		std::sort(rows.begin(), rows.end(), [](const vector<string> &a, const vector<string> &b) {
			for (idx_t col_idx = 0; col_idx < a.size(); col_idx++) {
				if (a[col_idx] != b[col_idx]) {
					return a[col_idx] < b[col_idx];
				}
			}
			return false;
		});

		// now reconstruct the values from the rows
		for (idx_t row_idx = 0; row_idx < nrows; row_idx++) {
			for (idx_t col_idx = 0; col_idx < ncols; col_idx++) {
				result_values_string[row_idx * ncols + col_idx] = std::move(rows[row_idx][col_idx]);
			}
		}
	} else if (sort_style == SortStyle::VALUE_SORT) {
		// sort values independently
		std::sort(result_values_string.begin(), result_values_string.end());
	}

	vector<string> comparison_values;
	if (values.size() == 1 && ResultIsFile(values[0])) {
		auto fname = runner.LoopReplacement(values[0], context.running_loops);
		string csv_error;
		comparison_values = LoadResultFromFile(fname, result.names, expected_column_count, csv_error);
		if (!csv_error.empty()) {
			logger.PrintErrorHeader(csv_error);
			return false;
		}
	} else {
		comparison_values = values;
	}

	// compute the hash of the results if there is a hash label or we are past the hash threshold
	string hash_value;
	if (runner.output_hash_mode || compare_hash) {
		MD5Context context;
		for (idx_t i = 0; i < total_value_count; i++) {
			context.Add(result_values_string[i]);
			context.Add("\n");
		}
		string digest = context.FinishHex();
		hash_value = to_string(total_value_count) + " values hashing to " + digest;
		if (runner.output_hash_mode) {
			logger.OutputHash(hash_value);
			return true;
		}
	}

	if (!compare_hash) {
		// check if the row/column count matches
		idx_t original_expected_columns = expected_column_count;
		bool column_count_mismatch = false;
		if (expected_column_count != result.ColumnCount()) {
			// expected column count is different from the count found in the result
			// we try to keep going with the number of columns in the result
			expected_column_count = result.ColumnCount();
			column_count_mismatch = true;
		}
		if (expected_column_count == 0) {
			return false;
		}
		idx_t expected_rows = comparison_values.size() / expected_column_count;
		// we first check the counts: if the values are equal to the amount of rows we expect the results to be row-wise
		bool row_wise = expected_column_count > 1 && comparison_values.size() == result.RowCount();
		if (!row_wise) {
			// the counts do not match up for it to be row-wise
			// however, this can also be because the query returned an incorrect # of rows
			// we make a guess: if everything contains tabs, we still treat the input as row wise
			bool all_tabs = true;
			for (auto &val : comparison_values) {
				if (val.find('\t') == string::npos) {
					all_tabs = false;
					break;
				}
			}
			row_wise = all_tabs;
		}
		if (row_wise) {
			// values are displayed row-wise, format row wise with a tab
			expected_rows = comparison_values.size();
			row_wise = true;
		} else if (comparison_values.size() % expected_column_count != 0) {
			if (column_count_mismatch) {
				logger.ColumnCountMismatch(result, query.values, original_expected_columns, row_wise);
			} else {
				logger.NotCleanlyDivisible(expected_column_count, comparison_values.size());
			}
			return false;
		}
		if (expected_rows != result.RowCount()) {
			if (column_count_mismatch) {
				logger.ColumnCountMismatch(result, query.values, original_expected_columns, row_wise);
			} else {
				logger.WrongRowCount(expected_rows, result, comparison_values, expected_column_count, row_wise);
			}
			return false;
		}

		if (row_wise) {
			idx_t current_row = 0;
			for (idx_t i = 0; i < total_value_count && i < comparison_values.size(); i++) {
				// split based on tab character
				auto splits = StringUtil::Split(comparison_values[i], "\t");
				if (splits.size() != expected_column_count) {
					if (column_count_mismatch) {
						logger.ColumnCountMismatch(result, query.values, original_expected_columns, row_wise);
					}
					logger.SplitMismatch(i + 1, expected_column_count, splits.size());
					return false;
				}
				for (idx_t c = 0; c < splits.size(); c++) {
					bool success = CompareValues(
					    logger, result, result_values_string[current_row * expected_column_count + c], splits[c],
					    current_row, c, comparison_values, expected_column_count, row_wise, result_values_string);
					if (!success) {
						return false;
					}
					// we do this just to increment the assertion counter
					string success_log =
					    StringUtil::Format("CheckQueryResult: %s:%d", query.file_name, query.query_line);
					REQUIRE(success_log.c_str());
				}
				current_row++;
			}
		} else {
			idx_t current_row = 0, current_column = 0;
			for (idx_t i = 0; i < total_value_count && i < comparison_values.size(); i++) {
				bool success = CompareValues(logger, result,
				                             result_values_string[current_row * expected_column_count + current_column],
				                             comparison_values[i], current_row, current_column, comparison_values,
				                             expected_column_count, row_wise, result_values_string);
				if (!success) {
					return false;
				}
				// we do this just to increment the assertion counter
				string success_log = StringUtil::Format("CheckQueryResult: %s:%d", query.file_name, query.query_line);
				REQUIRE(success_log.c_str());

				current_column++;
				if (current_column == expected_column_count) {
					current_row++;
					current_column = 0;
				}
			}
		}
		if (column_count_mismatch) {
			logger.ColumnCountMismatchCorrectResult(original_expected_columns, expected_column_count, result);
			return false;
		}
	} else {
		bool hash_compare_error = false;
		if (query_has_label) {
			// the query has a label: check if the hash has already been computed
			auto entry = runner.hash_label_map.find(query_label);
			if (entry == runner.hash_label_map.end()) {
				// not computed yet: add it tot he map
				runner.hash_label_map[query_label] = hash_value;
				runner.result_label_map[query_label] = std::move(owned_result);
			} else {
				hash_compare_error = entry->second != hash_value;
			}
		}
		if (result_is_hash) {
			D_ASSERT(values.size() == 1);
			hash_compare_error = values[0] != hash_value;
		}
		if (hash_compare_error) {
			QueryResult *expected_result = nullptr;
			if (runner.result_label_map.find(query_label) != runner.result_label_map.end()) {
				expected_result = runner.result_label_map[query_label].get();
			}
			logger.WrongResultHash(expected_result, result);
			return false;
		}
		REQUIRE(!hash_compare_error);
	}
	return true;
}